

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_distances.cc
# Opt level: O0

bool S2::AlwaysUpdateMinDistance<true>(S2Point *x,S2Point *a,S2Point *b,S1ChordAngle *min_dist)

{
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  S1ChordAngle SVar4;
  bool local_b1;
  double dist2;
  double local_88;
  double xb2;
  double local_68;
  double xa2;
  byte local_49;
  S2LogMessage local_48;
  S2LogMessageVoidify local_31;
  S1ChordAngle *local_30;
  S1ChordAngle *min_dist_local;
  S2Point *b_local;
  S2Point *a_local;
  S2Point *x_local;
  
  local_30 = min_dist;
  min_dist_local = (S1ChordAngle *)b;
  b_local = a;
  a_local = x;
  bVar1 = IsUnitLength(x);
  local_49 = 0;
  local_b1 = false;
  if (bVar1) {
    bVar1 = IsUnitLength(b_local);
    local_b1 = false;
    if (bVar1) {
      local_b1 = IsUnitLength((S2Point *)min_dist_local);
    }
  }
  if (((local_b1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_distances.cc"
               ,0xa7,kFatal,(ostream *)&std::cerr);
    local_49 = 1;
    poVar2 = S2LogMessage::stream(&local_48);
    poVar2 = std::operator<<(poVar2,
                             "Check failed: S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b) "
                            );
    S2LogMessageVoidify::operator&(&local_31,poVar2);
  }
  if ((local_49 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_48);
  }
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)&xb2,(BasicVector<Vector3,_double,_3UL> *)a_local,b_local);
  local_68 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                       ((BasicVector<Vector3,_double,_3UL> *)&xb2);
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator-
            ((D *)&dist2,(BasicVector<Vector3,_double,_3UL> *)a_local,(D *)min_dist_local);
  local_88 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                       ((BasicVector<Vector3,_double,_3UL> *)&dist2);
  bVar1 = AlwaysUpdateMinInteriorDistance<true>
                    (a_local,b_local,(S2Point *)min_dist_local,local_68,local_88,local_30);
  if (!bVar1) {
    pdVar3 = std::min<double>(&local_68,&local_88);
    SVar4 = S1ChordAngle::FromLength2(*pdVar3);
    local_30->length2_ = SVar4.length2_;
  }
  return true;
}

Assistant:

inline bool AlwaysUpdateMinDistance(const S2Point& x,
                                    const S2Point& a, const S2Point& b,
                                    S1ChordAngle* min_dist) {
  S2_DCHECK(S2::IsUnitLength(x) && S2::IsUnitLength(a) && S2::IsUnitLength(b));

  double xa2 = (x-a).Norm2(), xb2 = (x-b).Norm2();
  if (AlwaysUpdateMinInteriorDistance<always_update>(x, a, b, xa2, xb2,
                                                     min_dist)) {
    return true;  // Minimum distance is attained along the edge interior.
  }
  // Otherwise the minimum distance is to one of the endpoints.
  double dist2 = min(xa2, xb2);
  if (!always_update && dist2 >= min_dist->length2()) {
    return false;
  }
  *min_dist = S1ChordAngle::FromLength2(dist2);
  return true;
}